

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintTupleTo<std::tuple<long(*)(int_const*,int_const*,long,long*,int),long(*)(int_const*,int_const*,long,long*,int),aom_bit_depth>,3ul>
               (aom_bit_depth *t,ostream *param_2)

{
  PrintTupleTo<std::tuple<long(*)(int_const*,int_const*,long,long*,int),long(*)(int_const*,int_const*,long,long*,int),aom_bit_depth>,2ul>
            ();
  std::operator<<(param_2,", ");
  internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
  PrintValue<aom_bit_depth,void,std::ostream&>(t,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}